

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicTorsionType.hpp
# Opt level: O0

void __thiscall
OpenMD::HarmonicTorsionType::calcForce
          (HarmonicTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdCosPhi)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double __x;
  __type _Var2;
  RealType sinPhi;
  RealType phi;
  int in_stack_ffffffffffffffbc;
  undefined8 local_30;
  undefined8 local_10;
  
  if (in_XMM0_Qa <= 1.0) {
    local_10 = in_XMM0_Qa;
    if (in_XMM0_Qa < -1.0) {
      local_10 = -1.0;
    }
  }
  else {
    local_10 = 1.0;
  }
  dVar1 = acos(local_10);
  local_30 = sqrt(-local_10 * local_10 + 1.0);
  if (ABS(local_30) < 1e-06) {
    local_30 = (double)((ulong)local_30 & 0x8000000000000000 | 0x3eb0c6f7a0b5ed8d);
  }
  __x = *(double *)(in_RDI + 8) * 0.5;
  _Var2 = std::pow<double,int>(__x,in_stack_ffffffffffffffbc);
  *in_RSI = __x * _Var2;
  *in_RDX = (-*(double *)(in_RDI + 8) * (dVar1 - *(double *)(in_RDI + 0x10))) / local_30;
  return;
}

Assistant:

virtual void calcForce(RealType cosPhi, RealType& V, RealType& dVdCosPhi) {
      // check roundoff
      if (cosPhi > 1.0) {
        cosPhi = 1.0;
      } else if (cosPhi < -1.0) {
        cosPhi = -1.0;
      }

      RealType phi    = acos(cosPhi);
      RealType sinPhi = sqrt(1.0 - cosPhi * cosPhi);

      // trick to avoid divergence in angles near 0 and pi:

      if (fabs(sinPhi) < 1.0E-6) { sinPhi = copysign(1.0E-6, sinPhi); }

      V = 0.5 * d0_ * pow((phi - phi0_), 2);

      dVdCosPhi = -d0_ * (phi - phi0_) / sinPhi;
    }